

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Variable *obj)

{
  Variable local_38 [2];
  Variable *local_18;
  Variable *obj_local;
  ostream *stream_local;
  
  local_18 = obj;
  obj_local = (Variable *)stream;
  LiteScript::Variable::operator_cast_to_string(local_38);
  std::operator<<(stream,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return (ostream *)obj_local;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const LiteScript::Variable& obj) {
    stream << (std::string)(obj);
    return stream;
}